

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::reconnect_impl
          (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
           *client,shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                   *self)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pcVar4;
  undefined8 *extraout_RAX;
  null_logger_t *pnVar5;
  undefined8 *extraout_RAX_00;
  socklen_t __len;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false> in_RDI;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> cost_time;
  time_point post_time_point;
  bool ok;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_130;
  int local_11c;
  duration<long,std::ratio<1l,1000l>> local_118 [8];
  type_conflict local_110;
  pointer local_108;
  rep local_100;
  duration<long,_std::ratio<1L,_1000L>_> local_f8;
  undefined8 local_f0;
  bool local_e5 [197];
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  puVar2 = (undefined8 *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::
    LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = reconnect_impl;
    puVar2[1] = reconnect_impl;
    puVar2[0x14] = local_18;
    puVar2[0x15] = local_20;
    async_simple::coro::detail::
    LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::LazyPromise
              ((LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    async_simple::coro::detail::
    LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::
    get_return_object(in_stack_fffffffffffffda8);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xd5));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xd5));
      uVar3 = std::chrono::_V2::steady_clock::now();
      puVar2[0x16] = uVar3;
      pcVar4 = std::
               unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               ::operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                             *)0x459c32);
      __len = (socklen_t)pcVar4;
      std::
      __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x459c4d);
      std::__cxx11::string::string(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      cinatra::coro_http_client::connect
                ((coro_http_client *)(puVar2 + 0x18),(socklen_t)pcVar4,(sockaddr *)(puVar2 + 0xf),
                 __len);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x17));
      if (bVar1) {
        puVar2[0x13] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x17);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)in_stack_fffffffffffffdd0);
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x459e01);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x459e0e);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        local_e5[0] = cinatra::coro_http_client::is_ok
                                ((resp_data *)
                                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        local_f0 = std::chrono::_V2::steady_clock::now();
        local_100 = (rep)std::chrono::operator-
                                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                                    ,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90
                                                ));
        local_f8.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                       in_stack_fffffffffffffd88);
        pnVar5 = cinatra::null_logger_t::operator<<
                           ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [18])0x78f322);
        local_108 = std::
                    unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                    ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                           *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        pnVar5 = cinatra::null_logger_t::operator<<(pnVar5,&local_108);
        pnVar5 = cinatra::null_logger_t::operator<<(pnVar5,(char (*) [14])"} cost time: ");
        local_11c = 1;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_118,&local_11c);
        local_110 = std::chrono::operator/
                              ((duration<long,_std::ratio<1L,_1000L>_> *)
                               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                               (duration<long,_std::ratio<1L,_1000L>_> *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        pnVar5 = cinatra::null_logger_t::operator<<(pnVar5,&local_110);
        cinatra::null_logger_t::operator<<(pnVar5,(char (*) [3])0x78a359);
        std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::
        pair<bool_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&,_true>
                  (&local_130,local_e5,&local_f8);
        async_simple::coro::detail::
        LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::
        return_value<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                  ((LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88);
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar2 + 0xd6));
        if (bVar1) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xd6));
          async_simple::coro::detail::
          LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::
          ~LazyPromise((LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                        *)0x45a15c);
          if (puVar2 != (undefined8 *)0x0) {
            operator_delete(puVar2,0xd8);
          }
        }
        else {
          *puVar2 = 0;
          *(undefined1 *)((long)puVar2 + 0xd4) = 2;
          coro_io::client_pool
                    ((void *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (void *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xd4) = 1;
        coro_io::client_pool
                  ((void *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xd4) = 0;
      coro_io::client_pool
                ((void *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (void *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
  }
  return (Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>)
         in_RDI._coro.__handle_;
}

Assistant:

static async_simple::coro::Lazy<std::pair<bool, std::chrono::milliseconds>>
  reconnect_impl(std::unique_ptr<client_t>& client,
                 std::shared_ptr<client_pool>& self) {
    auto pre_time_point = std::chrono::steady_clock::now();
    auto result = co_await client->connect(self->host_name_);
    bool ok = client_t::is_ok(result);
    auto post_time_point = std::chrono::steady_clock::now();
    auto cost_time = std::chrono::duration_cast<std::chrono::milliseconds>(
        post_time_point - pre_time_point);
    CINATRA_LOG_TRACE << "reconnect client{" << client.get() << "} cost time: "
                      << cost_time / std::chrono::milliseconds{1} << "ms";
    co_return std::pair{ok, cost_time};
  }